

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O2

string * __thiscall
czh::error::location_to_str_abi_cxx11_
          (string *__return_storage_ptr__,error *this,source_location *l)

{
  char *pcVar1;
  uint __val;
  allocator<char> local_d9;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (*(undefined8 **)this == (undefined8 *)0x0) {
    pcVar1 = "";
  }
  else {
    pcVar1 = (char *)**(undefined8 **)this;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,pcVar1,&local_d9);
  std::operator+(&local_b8,&local_38,":");
  if (*(long *)this == 0) {
    __val = 0;
  }
  else {
    __val = *(uint *)(*(long *)this + 0x10);
  }
  std::__cxx11::to_string(&local_d8,__val);
  std::operator+(&local_98,&local_b8,&local_d8);
  std::operator+(&local_78,&local_98,":");
  if (*(long *)this == 0) {
    pcVar1 = "";
  }
  else {
    pcVar1 = *(char **)(*(long *)this + 8);
  }
  std::operator+(&local_58,&local_78,pcVar1);
  std::operator+(__return_storage_ptr__,&local_58,"()");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string location_to_str(const std::source_location &l)
  {
    return std::string(l.file_name()) + ":" + std::to_string(l.line()) +
           ":" + l.function_name() + "()";
  }